

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::SumSquares1DTest_ExtremeValues_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::SumSquares1DTest_ExtremeValues_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<libaom_test::FuncParam<unsigned_long(*)(short_const*,unsigned_int)>>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x38);
  Test::Test(this_00);
  *(undefined4 *)
   &this_00[1].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0xbaba;
  this_00[2]._vptr_Test = (_func_int **)0x0;
  this_00[2].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[3]._vptr_Test = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01072150;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SumSquares1DTest_ExtremeValues_Test_01072190;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }